

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall crnd::vector<unsigned_short>::resize(vector<unsigned_short> *this,uint32 new_size)

{
  bool bVar1;
  uint in_ESI;
  unsigned_short *in_RDI;
  uint32 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (*(uint *)(in_RDI + 4) != in_ESI) {
    if (in_ESI < *(uint *)(in_RDI + 4)) {
      scalar_type<unsigned_short>::destruct_array
                ((unsigned_short *)(*(long *)in_RDI + (ulong)in_ESI * 2),
                 *(int *)(in_RDI + 4) - in_ESI);
    }
    else {
      if ((*(uint *)(in_RDI + 6) < in_ESI) &&
         (bVar1 = increase_capacity((vector<unsigned_short> *)
                                    CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                    (uint32)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0)),
         !bVar1)) {
        return false;
      }
      scalar_type<unsigned_short>::construct_array(in_RDI,in_stack_ffffffffffffffdc);
    }
    *(uint *)(in_RDI + 4) = in_ESI;
  }
  return true;
}

Assistant:

inline bool resize(uint32 new_size) {
    if (m_size != new_size) {
      if (new_size < m_size)
        scalar_type<T>::destruct_array(m_p + new_size, m_size - new_size);
      else {
        if (new_size > m_capacity) {
          if (!increase_capacity(new_size, new_size == (m_size + 1)))
            return false;
        }

        scalar_type<T>::construct_array(m_p + m_size, new_size - m_size);
      }

      m_size = new_size;
    }

    return true;
  }